

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O1

void QUnifiedTimer::resumeAnimationTimer(QAbstractAnimationTimer *timer)

{
  QUnifiedTimer *this;
  long in_RDI;
  long in_FS_OFFSET;
  QAbstractAnimationTimer *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(char *)(in_RDI + 0x11) == '\x01') {
    *(undefined1 *)(in_RDI + 0x11) = 0;
    this = instance(true);
    QtPrivate::sequential_erase_one<QList<QAbstractAnimationTimer*>,QAbstractAnimationTimer*>
              (&this->pausedAnimationTimers,&local_18);
    localRestart((QUnifiedTimer *)this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUnifiedTimer::resumeAnimationTimer(QAbstractAnimationTimer *timer)
{
    if (!timer->isPaused)
        return;

    timer->isPaused = false;
    QUnifiedTimer *inst = QUnifiedTimer::instance();
    inst->pausedAnimationTimers.removeOne(timer);
    inst->localRestart();
}